

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O0

void google::protobuf::internal::PrimitiveTypeHelper<3>::Serialize
               (void *ptr,CodedOutputStream *output)

{
  long *plVar1;
  CodedOutputStream *output_local;
  void *ptr_local;
  
  plVar1 = Get<long>(ptr);
  WireFormatLite::WriteInt64NoTag(*plVar1,output);
  return;
}

Assistant:

static void Serialize(const void* ptr, io::CodedOutputStream* output) {
    WireFormatLite::WriteInt64NoTag(Get<int64_t>(ptr), output);
  }